

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneticAlgorithm.cpp
# Opt level: O1

void __thiscall GeneticAlgorithm::resultToFile(GeneticAlgorithm *this)

{
  pointer pPVar1;
  double dVar2;
  double dVar3;
  char cVar4;
  ostream *poVar5;
  pointer pPVar6;
  Population p;
  ofstream myfile;
  undefined4 uStack_258;
  undefined4 uStack_254;
  vector<Chromosome,_std::allocator<Chromosome>_> local_248;
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  std::ofstream::ofstream
            (&local_230,"C:\\Users\\alican\\ClionProjects\\GeneticAlgorithm\\viewer\\results.tsv",
             _S_out);
  cVar4 = std::__basic_file<char>::is_open();
  if (cVar4 != '\0') {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"Generation",10);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"\t",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"max fitness",0xb);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"\t",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"min fitness",0xb);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"\t",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"average fitness",0xf);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"\n",1);
    pPVar6 = (this->generations).super__Vector_base<Population,_std::allocator<Population>_>._M_impl
             .super__Vector_impl_data._M_start;
    pPVar1 = (this->generations).super__Vector_base<Population,_std::allocator<Population>_>._M_impl
             .super__Vector_impl_data._M_finish;
    if (pPVar6 != pPVar1) {
      do {
        dVar2 = pPVar6->minFitness;
        dVar3 = pPVar6->maxFitness;
        uStack_258 = (undefined4)((ulong)*(undefined8 *)((long)&pPVar6->maxFitness + 4) >> 0x20);
        uStack_254 = (undefined4)*(undefined8 *)((long)&pPVar6->averageFitness + 4);
        std::vector<Chromosome,_std::allocator<Chromosome>_>::vector
                  (&local_248,&pPVar6->chromosomes);
        poVar5 = std::ostream::_M_insert<double>(dVar2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\t",1);
        poVar5 = std::ostream::_M_insert<double>(dVar3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\t",1);
        poVar5 = std::ostream::_M_insert<double>((double)CONCAT44(uStack_254,uStack_258));
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
        std::vector<Chromosome,_std::allocator<Chromosome>_>::~vector(&local_248);
        pPVar6 = pPVar6 + 1;
      } while (pPVar6 != pPVar1);
    }
    std::ofstream::close();
  }
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = std::__cxx11::numpunct<char>::id;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void GeneticAlgorithm::resultToFile() {
    std::ofstream myfile ("C:\\Users\\alican\\ClionProjects\\GeneticAlgorithm\\viewer\\results.tsv");
    if (myfile.is_open())
    {
        myfile << "Generation" << "\t" << "max fitness" << "\t" << "min fitness" << "\t" << "average fitness" << "\n";
        for (auto p : generations){
            myfile << p.minFitness << "\t" << p.maxFitness << "\t" << p.averageFitness << "\n";
        };
        myfile.close();
    }
}